

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O2

int __thiscall SliceUnit::deserializeSliceType(SliceUnit *this,uint8_t *buffer,uint8_t *end)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  if ((long)end - (long)buffer < 2) {
LAB_001ccd59:
    iVar1 = -10;
  }
  else {
    iVar1 = NALUnit::deserialize(&this->super_NALUnit,buffer,end);
    if (iVar1 != 0) {
      return iVar1;
    }
    if ((this->super_NALUnit).nal_unit_type == nuSliceExt) {
      if ((ulong)((long)end - (long)buffer) < 5) goto LAB_001ccd59;
      uVar3 = 4;
      if ((buffer[1] == 0) && (buffer[2] == '\0')) {
        uVar3 = (ulong)(buffer[3] == '\x03') | 4;
      }
      this->non_idr_flag = buffer[1] & 0x40;
      this->anchor_pic_flag = buffer[uVar3 - 1] & 4;
    }
    else {
      uVar3 = 1;
    }
    BitStreamReader::setBuffer(&(this->super_NALUnit).bitReader,buffer + uVar3,end);
    uVar2 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
    this->first_mb_in_slice = uVar2;
    uVar2 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
    if (uVar2 < 10) {
      this->slice_type = uVar2;
      this->orig_slice_type = uVar2;
      iVar1 = 0;
      if (4 < uVar2) {
        this->slice_type = uVar2 - 5;
      }
    }
    else {
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int SliceUnit::deserializeSliceType(uint8_t* buffer, uint8_t* end)
{
    if (end - buffer < 2)
        return NOT_ENOUGH_BUFFER;

    const int rez = NALUnit::deserialize(buffer, end);
    if (rez != 0)
        return rez;

    try
    {
        int offset = 1;
        if (nal_unit_type == NALType::nuSliceExt)
        {
            if (end - buffer < 5)
                return NOT_ENOUGH_BUFFER;
            offset += 3;
            if (buffer[1] == 0 && buffer[2] == 0 && buffer[3] == 3)
                offset++;  // inplace decode header
            non_idr_flag = buffer[1] & 0x40;
            anchor_pic_flag = buffer[offset - 1] & 0x04;
        }

        bitReader.setBuffer(buffer + offset, end);
        first_mb_in_slice = extractUEGolombCode();
        const unsigned sliceType = extractUEGolombCode();
        if (sliceType > 9)
            return 1;
        orig_slice_type = slice_type = sliceType;
        if (slice_type > 4)
            slice_type -= 5;  // +5 flag is: all other slice at this picture must be same type

        return 0;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}